

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

attr_list cod_ev_get_attrs(cod_exec_context ec,int queue,int index)

{
  event_item *peVar1;
  ev_state_data *ev_state;
  queue_item *pqVar2;
  attr_list p_Var3;
  
  ev_state = (ev_state_data *)cod_get_client_data(ec,0x34567890);
  pqVar2 = cod_find_index_rel(ev_state,queue,index);
  if (pqVar2 == (queue_item *)0x0) {
    p_Var3 = (attr_list)0x0;
    printf("No item at index %d on queue %d\n",(ulong)(uint)index,queue);
  }
  else {
    peVar1 = pqVar2->item;
    p_Var3 = peVar1->attrs;
    if (p_Var3 == (attr_list)0x0) {
      p_Var3 = CMint_create_attr_list
                         (ev_state->cm,
                          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                          ,0x40e);
      peVar1->attrs = p_Var3;
    }
  }
  return p_Var3;
}

Assistant:

static attr_list cod_ev_get_attrs(cod_exec_context ec, int queue, int index) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    queue_item *item = cod_find_index_rel(ev_state, queue, index);
    attr_list *pattr;

    if (NULL == item) {
	printf("No item at index %d on queue %d\n", index, queue);

	return NULL;
    }
    pattr = &item->item->attrs;
    if (!*pattr) {
        *pattr = CMcreate_attr_list(ev_state->cm);
    }
    return *pattr;
}